

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O3

void atommem_d(disctx *ctx,ull *a,ull *m,void *v)

{
  int iVar1;
  bool bVar2;
  easm_expr *peVar3;
  easm_expr *e2;
  easm_expr *e1;
  ull uVar4;
  char *pcVar5;
  easm_mods *peVar6;
  litem **pplVar7;
  litem *plVar8;
  easm_expr *e2_00;
  easm_expr_type type;
  int iVar9;
  
  if (*(reg **)((long)v + 0x10) == (reg *)0x0) {
    peVar3 = (easm_expr *)0x0;
  }
  else {
    peVar3 = printreg(ctx,a,m,*(reg **)((long)v + 0x10));
  }
  type = EASM_EXPR_MEM;
  bVar2 = true;
  e2 = peVar3;
  if (*(rbitfield **)((long)v + 0x18) != (rbitfield *)0x0) {
    e2 = getrbf(*(rbitfield **)((long)v + 0x18),a,m);
    if (*(int *)((long)v + 0x2c) != 0) {
      type = EASM_EXPR_MEMPP;
      bVar2 = false;
      e2_00 = e2;
      e2 = peVar3;
      goto LAB_0024481d;
    }
    if (peVar3 == (easm_expr *)0x0) {
      e2_00 = (easm_expr *)0x0;
      goto LAB_0024481d;
    }
    e2 = easm_expr_bin(EASM_EXPR_ADD,peVar3,e2);
  }
  e2_00 = (easm_expr *)0x0;
LAB_0024481d:
  peVar3 = e2;
  if ((*(reg **)((long)v + 0x20) != (reg *)0x0) &&
     (e1 = printreg(ctx,a,m,*(reg **)((long)v + 0x20)), e1 != (easm_expr *)0x0)) {
    peVar3 = e1;
    if (*(int *)((long)v + 0x28) != 0) {
      peVar3 = easm_expr_num(EASM_EXPR_NUM,1L << ((byte)*(int *)((long)v + 0x28) & 0x3f));
      peVar3 = easm_expr_bin(EASM_EXPR_MUL,e1,peVar3);
    }
    if (e2 != (easm_expr *)0x0) {
      peVar3 = easm_expr_bin(EASM_EXPR_ADD,e2,peVar3);
    }
  }
  if (peVar3 == (easm_expr *)0x0) {
    peVar3 = easm_expr_num(EASM_EXPR_NUM,0);
  }
  if (*v == 0) {
    if (!bVar2) {
      abort();
    }
  }
  else {
    if (e2_00 == (easm_expr *)0x0) {
      peVar3 = easm_expr_un(type,peVar3);
    }
    else {
      peVar3 = easm_expr_bin(type,peVar3,e2_00);
    }
    pcVar5 = *v;
    if (*(bitfield **)((long)v + 8) == (bitfield *)0x0) {
      pcVar5 = strdup(pcVar5);
    }
    else {
      uVar4 = getbf(*(bitfield **)((long)v + 8),a,m);
      pcVar5 = aprintf("%s%lld",pcVar5,uVar4);
    }
    peVar3->str = pcVar5;
    peVar6 = (easm_mods *)calloc(0x28,1);
    peVar3->mods = peVar6;
  }
  if ((*(int *)((long)v + 0x30) != 0) && (peVar3->type == EASM_EXPR_MEM)) {
    peVar3->special = EASM_SPEC_LITERAL;
  }
  iVar9 = ctx->atomsnum;
  iVar1 = ctx->atomsmax;
  if (iVar9 < iVar1) {
    pplVar7 = ctx->atoms;
  }
  else {
    iVar9 = 0x10;
    if (iVar1 != 0) {
      iVar9 = iVar1 * 2;
    }
    ctx->atomsmax = iVar9;
    pplVar7 = (litem **)realloc(ctx->atoms,(long)iVar9 << 3);
    ctx->atoms = pplVar7;
    iVar9 = ctx->atomsnum;
  }
  plVar8 = (litem *)calloc(0x20,1);
  plVar8->type = LITEM_EXPR;
  plVar8->expr = peVar3;
  ctx->atomsnum = iVar9 + 1;
  pplVar7[iVar9] = plVar8;
  return;
}

Assistant:

void atommem_d DPROTO {
	const struct mem *mem = v;
	int type = EASM_EXPR_MEM;
	struct easm_expr *expr = 0;
	struct easm_expr *pexpr = 0;
	if (mem->reg)
		expr = printreg(ctx, a, m, mem->reg);
	if (mem->imm) {
		struct easm_expr *imm = GETRBF(mem->imm);
		if (mem->postincr) {
			type = EASM_EXPR_MEMPP;
			pexpr = imm;
		} else {
			if (expr) {
				expr = easm_expr_bin(EASM_EXPR_ADD, expr, imm);
			} else {
				expr = imm;
			}
		}
	}
	if (mem->reg2) {
		struct easm_expr *sexpr = printreg(ctx, a, m, mem->reg2);
		if (sexpr) {
			if (mem->reg2shr) {
				uint64_t num = 1ull << mem->reg2shr;
				struct easm_expr *ssexpr = easm_expr_num(EASM_EXPR_NUM, num);
				sexpr = easm_expr_bin(EASM_EXPR_MUL, sexpr, ssexpr);
			}
			if (expr)
				expr = easm_expr_bin(EASM_EXPR_ADD, expr, sexpr);
			else
				expr = sexpr;
		}
	}
	if (!expr) expr = easm_expr_num(EASM_EXPR_NUM, 0);
	if (mem->name) {
		struct easm_expr *nex;
		if (pexpr)
			nex = easm_expr_bin(type, expr, pexpr);
		else
			nex = easm_expr_un(type, expr);
		if (mem->idx)
			nex->str = aprintf("%s%lld", mem->name, GETBF(mem->idx));
		else
			nex->str = strdup(mem->name);
		nex->mods = calloc(sizeof *nex->mods, 1);
		expr = nex;
	} else if (type != EASM_EXPR_MEM) {
		abort();
	}
	if (mem->literal && expr->type == EASM_EXPR_MEM)
		expr->special = EASM_SPEC_LITERAL;
	ADDARRAY(ctx->atoms, makeli(expr));
}